

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5FlushSecureDelete(Fts5Index *p,Fts5Structure *pStruct,char *zTerm,int nTerm,i64 iRowid)

{
  int *pRc;
  uint iSegid;
  Fts5Config *pFVar1;
  ushort *pData;
  Fts5StructureSegment *pFVar2;
  ushort *pData_00;
  u8 *puVar3;
  int iVar4;
  sqlite3_stmt *pStmt_00;
  u32 uVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  char *zSql;
  void *__dest;
  long lVar13;
  Fts5Data *pFVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  ushort uVar18;
  uint uVar19;
  uint uVar20;
  Fts5Config *pConfig;
  uint uVar21;
  uint uVar22;
  Fts5SegIter *pFVar23;
  uint uVar24;
  uint uVar25;
  Fts5Iter *pIter_00;
  uint uVar26;
  long lVar27;
  u8 *__src;
  size_t sVar28;
  int iVar29;
  size_t __n;
  long in_FS_OFFSET;
  bool bVar30;
  int local_d8;
  int local_b0;
  uchar *local_98;
  Fts5Iter *pIter;
  int nSuffix2;
  int nPrefix2;
  int nPos;
  undefined4 uStack_4c;
  sqlite3_stmt *pStmt;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pIter = (Fts5Iter *)0x0;
  pFVar1 = p->pConfig;
  if (pFVar1->iVersion != 5) {
    pStmt = (sqlite3_stmt *)0x0;
    zSql = sqlite3_mprintf("REPLACE INTO %Q.\'%q_config\' VALUES (\'version\', %d)",pFVar1->zDb,
                           pFVar1->zName);
    fts5IndexPrepareStmt(p,&pStmt,zSql);
    pStmt_00 = pStmt;
    if (p->rc == 0) {
      sqlite3_step(pStmt);
      iVar7 = sqlite3_finalize(pStmt_00);
      if (p->rc == 0) {
        p->rc = iVar7;
      }
      pFVar1->iCookie = pFVar1->iCookie + 1;
      pFVar1->iVersion = 5;
    }
  }
  fts5MultiIterNew(p,pStruct,0x40,(Fts5Colset *)0x0,(u8 *)zTerm,nTerm,-1,0,&pIter);
  pIter_00 = pIter;
  pRc = &p->rc;
  if ((((p->rc != 0) || ((pIter->base).bEof != '\0')) ||
      ((pIter->aSeg[pIter->aFirst[1].iFirst].iRowid < iRowid &&
       (fts5MultiIterNextFrom(p,pIter,iRowid), p->rc != 0)))) || ((pIter_00->base).bEof != '\0'))
  goto LAB_001ca9e4;
  uVar18 = pIter_00->aFirst[1].iFirst;
  if (pIter_00->aSeg[uVar18].iRowid != iRowid) goto LAB_001ca9e4;
  iVar7 = p->pConfig->eDetail;
  pFVar14 = pIter_00->aSeg[uVar18].pLeaf;
  iSegid = (pIter_00->aSeg[uVar18].pSeg)->iSegid;
  pData = (ushort *)pFVar14->p;
  iVar9 = pFVar14->nn;
  uVar24 = pFVar14->szLeaf;
  pStmt = (sqlite3_stmt *)0x0;
  iVar29 = iVar9 - uVar24;
  __dest = sqlite3Fts5MallocZero(pRc,(long)(iVar29 + 0x10));
  if (p->rc != 0) goto LAB_001ca9e4;
  pFVar23 = pIter_00->aSeg + uVar18;
  memcpy(__dest,(void *)((long)(int)uVar24 + (long)pData),(long)iVar29);
  lVar13 = (long)pFVar23->iLeafPgno;
  if (pFVar23->iLeafPgno == pFVar23->iTermLeafPgno) {
    uVar22 = pFVar23->iTermLeafOffset;
  }
  else {
    uVar22 = (uint)(ushort)(*pData << 8 | *pData >> 8);
  }
  bVar6 = sqlite3Fts5GetVarint((uchar *)((long)pData + (long)(int)uVar22),(u64 *)&pStmt);
  uVar21 = uVar22 + bVar6;
  if (iVar7 == 1) {
    lVar27 = pFVar23->iLeafOffset;
    while (lVar17 = (long)(int)uVar21, lVar17 < lVar27) {
      bVar30 = *(char *)((long)pData + lVar17) == '\0';
      uVar22 = uVar21 + bVar30 +
               (uint)(*(char *)((long)pData + (long)(int)(bVar30 + uVar21)) == '\0');
      bVar6 = sqlite3Fts5GetVarint((uchar *)((long)pData + (long)(int)uVar22),(u64 *)&pStmt);
      uVar21 = uVar22 + bVar6;
    }
    if ((int)uVar21 < pFVar23->iEndofDoclist) {
      uVar21 = uVar21 + (*(char *)((long)pData + lVar17) == '\0');
    }
    if ((int)uVar21 < pFVar23->iEndofDoclist) {
      uVar21 = uVar21 + (*(char *)((long)pData + (long)(int)uVar21) == '\0');
    }
  }
  else {
    _nPos = _nPos & 0xffffffff00000000;
    iVar7 = sqlite3Fts5GetVarint32((uchar *)((long)pData + (long)(int)uVar21),(u32 *)&nPos);
    lVar27 = pFVar23->iLeafOffset;
    for (iVar7 = uVar21 + iVar7; iVar7 < lVar27; iVar7 = uVar22 + bVar6 + iVar7) {
      uVar22 = nPos / 2 + iVar7;
      bVar6 = sqlite3Fts5GetVarint((uchar *)((long)pData + (long)(int)uVar22),(u64 *)&pStmt);
      iVar7 = sqlite3Fts5GetVarint32
                        ((uchar *)((long)pData + (long)(int)(uVar22 + bVar6)),(u32 *)&nPos);
    }
    uVar21 = (int)lVar27 + pFVar23->nPos;
  }
  bVar30 = false;
  if ((int)uVar24 <= (int)uVar21) {
    bVar30 = true;
    pFVar2 = pFVar23->pSeg;
    iVar7 = p->pConfig->eDetail;
    while ((lVar13 = lVar13 + 1, *pRc == 0 && (lVar13 <= pFVar2->pgnoLast))) {
      lVar27 = ((ulong)(uint)pFVar2->iSegid << 0x25) + lVar13;
      pFVar14 = fts5DataRead(p,lVar27);
      if (pFVar14 == (Fts5Data *)0x0) goto LAB_001ca56f;
      pData_00 = (ushort *)pFVar14->p;
      uVar18 = *pData_00 << 8 | *pData_00 >> 8;
      uVar21 = (uint)uVar18;
      _nPos = CONCAT44(uStack_4c,(uint)uVar18);
      if (uVar18 != 0) {
        bVar30 = false;
LAB_001ca4e5:
        if (iVar7 == 1) goto LAB_001ca56f;
        iVar7 = pFVar14->szLeaf;
        if (((iVar7 <= (int)uVar21) || ((int)uVar21 < 4)) || (iVar10 = pFVar14->nn, iVar10 < iVar7))
        {
          *pRc = 0x10b;
          goto LAB_001ca56f;
        }
        if (iVar10 - iVar7 == 0 || iVar10 < iVar7) {
          uVar19 = 0;
          local_98 = (uchar *)0x0;
        }
        else {
          local_3c = 0;
          iVar8 = sqlite3Fts5GetVarint32((uchar *)((long)iVar7 + (long)pData_00),&local_3c);
          uVar5 = local_3c;
          if ((int)local_3c < (int)uVar21) {
            *pRc = 0x10b;
            goto LAB_001ca56f;
          }
          local_98 = (uchar *)sqlite3Fts5MallocZero(pRc,(long)((iVar10 - iVar7) + 2));
          if (local_98 == (uchar *)0x0) goto LAB_001ca56f;
          iVar8 = iVar8 + iVar7;
          uVar19 = sqlite3Fts5PutVarint(local_98,(long)(int)(uVar5 - (uVar21 - 4)));
          iVar7 = pFVar14->nn - iVar8;
          if (iVar7 != 0 && iVar8 <= pFVar14->nn) {
            memcpy(local_98 + (int)uVar19,(void *)((long)iVar8 + (long)pData_00),(long)iVar7);
            uVar19 = (uVar19 - iVar8) + pFVar14->nn;
          }
          iVar7 = pFVar14->szLeaf;
        }
        iVar7 = iVar7 - (uVar21 - 4);
        memmove(pData_00 + 2,(void *)((ulong)uVar21 + (long)pData_00),(long)(iVar7 + -4));
        pData_00[1] = (ushort)iVar7 << 8 | (ushort)iVar7 >> 8;
        if (*(char *)((long)pData_00 + 1) != '\0' || (char)*pData_00 != '\0') {
          *pData_00 = 0x400;
        }
        if (0 < (int)uVar19) {
          memcpy((void *)((long)iVar7 + (long)pData_00),local_98,(ulong)uVar19);
          iVar7 = iVar7 + uVar19;
        }
        sqlite3_free(local_98);
        fts5DataWrite(p,lVar27,(u8 *)pData_00,iVar7);
        goto LAB_001ca56f;
      }
      if (pFVar14->szLeaf != pFVar14->nn) {
        sqlite3Fts5GetVarint32((uchar *)((long)pFVar14->szLeaf + (long)pData_00),(u32 *)&nPos);
        uVar21 = nPos;
        if (nPos != 0) goto LAB_001ca4e5;
      }
      local_3c = 0x4000000;
      if (iVar7 != 1) {
        fts5DataWrite(p,lVar27,(u8 *)&local_3c,4);
      }
      sqlite3_free(pFVar14);
    }
    pFVar14 = (Fts5Data *)0x0;
LAB_001ca56f:
    sqlite3_free(pFVar14);
    uVar21 = uVar24;
  }
  if (pFVar23->bDel == '\0') {
    if (uVar21 != uVar24) {
      uVar19 = 0;
      uVar26 = 0;
      while ((int)uVar26 < iVar29) {
        _nPos = _nPos & 0xffffffff00000000;
        iVar7 = sqlite3Fts5GetVarint32((uchar *)((ulong)uVar26 + (long)__dest),(u32 *)&nPos);
        uVar19 = uVar19 + nPos;
        uVar26 = uVar26 + iVar7;
        if (uVar19 == uVar21) {
          bVar30 = true;
        }
      }
    }
    uVar26 = uVar24;
    uVar19 = uVar22;
    if (uVar22 == (ushort)(*pData << 8 | *pData >> 8)) {
      if ((uVar21 == uVar24) || (bVar30)) {
        *pData = 0;
        if (pFVar23->bDel != '\0') goto LAB_001ca58c;
        goto LAB_001ca77f;
      }
    }
    else {
LAB_001ca77f:
      if (bVar30) {
        lVar13 = (long)pFVar23->iLeafPgno;
        if ((pFVar23->iLeafPgno == pFVar23->iTermLeafPgno) && (uVar22 == pFVar23->iTermLeafOffset))
        {
          iVar7 = 1;
          uVar19 = 0;
          for (uVar20 = 0; (int)uVar20 < iVar29; uVar20 = uVar20 + iVar10) {
            _nPos = _nPos & 0xffffffff00000000;
            iVar10 = sqlite3Fts5GetVarint32((uchar *)((ulong)uVar20 + (long)__dest),(u32 *)&nPos);
            if (uVar22 < nPos + uVar19) break;
            iVar7 = iVar7 + -1;
            uVar19 = nPos + uVar19;
          }
          uVar20 = uVar19;
          if (uVar21 != uVar24) {
            _nPos = _nPos & 0xffffffff00000000;
            nPrefix2 = 0;
            nSuffix2 = 0;
            iVar10 = sqlite3Fts5GetVarint32
                               ((uchar *)((long)(int)uVar21 + (long)pData),(u32 *)&nPrefix2);
            iVar8 = sqlite3Fts5GetVarint32
                              ((uchar *)((long)(int)(iVar10 + uVar21) + (long)pData),
                               (u32 *)&nSuffix2);
            if (iVar7 == 0) {
              iVar11 = 0;
              uVar22 = uVar19;
            }
            else {
              iVar11 = sqlite3Fts5GetVarint32
                                 ((uchar *)((long)pData + (long)(int)uVar19),(u32 *)&nPos);
              uVar22 = iVar11 + uVar19;
              iVar11 = nPos;
            }
            uVar25 = iVar10 + uVar21 + iVar8;
            iVar12 = sqlite3Fts5GetVarint32((uchar *)((long)pData + (long)(int)uVar22),&local_3c);
            iVar4 = nPrefix2;
            iVar8 = nSuffix2;
            iVar10 = nPrefix2;
            if (iVar11 < nPrefix2) {
              iVar10 = iVar11;
            }
            sVar28 = (size_t)nSuffix2;
            iVar15 = nPrefix2 - iVar10;
            iVar16 = iVar15 + nSuffix2;
            uVar20 = uVar21;
            if (((int)uVar24 < (int)(uVar22 + iVar12 + iVar16)) ||
               (uVar26 = nSuffix2 + uVar25, (int)uVar24 < (int)uVar26)) {
              *pRc = 0x10b;
              uVar26 = uVar25;
            }
            else {
              if (iVar7 != 0) {
                iVar7 = sqlite3Fts5PutVarint
                                  ((uchar *)((long)(int)uVar19 + (long)pData),(long)iVar10);
                uVar19 = uVar19 + iVar7;
              }
              iVar7 = sqlite3Fts5PutVarint((uchar *)((long)pData + (long)(int)uVar19),(long)iVar16);
              iVar7 = uVar19 + iVar7;
              if ((pFVar23->term).n < iVar4) {
                *pRc = 0x10b;
              }
              else if (iVar11 < iVar4) {
                memcpy((void *)((long)pData + (long)iVar7),(pFVar23->term).p + iVar10,(long)iVar15);
                iVar7 = iVar7 + iVar15;
              }
              memmove((void *)((long)pData + (long)iVar7),(void *)((long)(int)uVar25 + (long)pData),
                      sVar28);
              uVar19 = iVar7 + iVar8;
            }
          }
        }
        else {
          uVar20 = 0;
          uVar26 = uVar21;
          if (uVar22 == 4) {
            lVar17 = (ulong)iSegid << 0x25;
            lVar27 = lVar13 << 0x20;
            do {
              lVar27 = lVar27 + -0x100000000;
              lVar13 = lVar13 + -1;
              if ((lVar13 <= pFVar23->iTermLeafPgno) ||
                 (pFVar14 = fts5DataRead(p,lVar17 + lVar13), pFVar14 == (Fts5Data *)0x0)) break;
              iVar7 = pFVar14->nn;
              sqlite3_free(pFVar14);
            } while (iVar7 == 4);
            if (pFVar23->iTermLeafPgno == (int)lVar13) {
              lVar17 = (lVar27 >> 0x20) + lVar17;
              pFVar14 = fts5DataRead(p,lVar17);
              if (pFVar14 != (Fts5Data *)0x0) {
                iVar7 = pFVar14->szLeaf;
                if (iVar7 == pFVar23->iTermLeafOffset) {
                  puVar3 = pFVar14->p;
                  __src = puVar3 + iVar7;
                  iVar10 = pFVar14->nn;
                  iVar8 = 0;
                  sVar28 = 0;
                  do {
                    __n = sVar28;
                    _nPos = _nPos & 0xffffffff00000000;
                    iVar11 = sqlite3Fts5GetVarint32(__src + __n,(u32 *)&nPos);
                    iVar8 = iVar8 + nPos;
                    uVar22 = (int)__n + iVar11;
                    sVar28 = (ulong)uVar22;
                  } while ((int)uVar22 < iVar10 - iVar7);
                  memmove(puVar3 + iVar8,__src,__n);
                  *(ushort *)(pFVar14->p + 2) = (ushort)iVar8 << 8 | (ushort)iVar8 >> 8;
                  fts5DataWrite(p,lVar17,pFVar14->p,(int)__n + iVar8);
                  if (__n == 0) {
                    fts5SecureDeleteIdxEntry(p,iSegid,pFVar23->iTermLeafPgno);
                  }
                }
              }
              sqlite3_free(pFVar14);
            }
            uVar20 = 0;
            uVar19 = 4;
          }
        }
        goto LAB_001ca5c1;
      }
    }
    uVar20 = 0;
    if (uVar21 != uVar24) {
      _nPos = 0;
      bVar6 = sqlite3Fts5GetVarint((uchar *)((long)(int)uVar21 + (long)pData),(u64 *)&nPos);
      iVar7 = sqlite3Fts5PutVarint((uchar *)((long)(int)uVar22 + (long)pData),(u64)(pStmt + _nPos));
      uVar19 = iVar7 + uVar22;
      uVar20 = 0;
      uVar26 = bVar6 + uVar21;
    }
  }
  else {
LAB_001ca58c:
    iVar7 = sqlite3Fts5PutVarint((uchar *)((long)(int)uVar22 + (long)pData),(u64)pStmt);
    *(undefined1 *)((long)pData + (long)(int)(iVar7 + uVar22)) = 1;
    uVar20 = 0;
    uVar26 = uVar21;
    uVar19 = uVar22 + iVar7 + 1;
  }
LAB_001ca5c1:
  if (*pRc == 0) {
    memmove((void *)((long)(int)uVar19 + (long)pData),(void *)((long)(int)uVar26 + (long)pData),
            (long)(int)(iVar9 - uVar26));
    iVar7 = uVar24 - (uVar26 - uVar19);
    pData[1] = (ushort)iVar7 << 8 | (ushort)iVar7 >> 8;
    local_d8 = 0;
    uVar24 = 0;
    local_b0 = iVar7;
    for (uVar22 = 0; (int)uVar22 < iVar29; uVar22 = uVar22 + iVar9) {
      _nPos = _nPos & 0xffffffff00000000;
      iVar9 = sqlite3Fts5GetVarint32((uchar *)((ulong)uVar22 + (long)__dest),(u32 *)&nPos);
      uVar24 = uVar24 + nPos;
      if (uVar24 != uVar20) {
        iVar10 = 0;
        if ((int)uVar19 < (int)uVar24) {
          iVar10 = uVar26 - uVar19;
        }
        iVar8 = sqlite3Fts5PutVarint
                          ((uchar *)((long)local_b0 + (long)pData),
                           (long)(int)((uVar24 - iVar10) - local_d8));
        local_b0 = local_b0 + iVar8;
        local_d8 = uVar24 - iVar10;
      }
    }
    iVar9 = pFVar23->iLeafPgno;
    if ((0 < iVar29) && (iVar7 == local_b0)) {
      if (iVar9 == 1) {
        iVar9 = 1;
      }
      else {
        fts5SecureDeleteIdxEntry(p,iSegid,iVar9);
        iVar9 = pFVar23->iLeafPgno;
      }
    }
    fts5DataWrite(p,(long)iVar9 + ((ulong)iSegid << 0x25),(u8 *)pData,local_b0);
  }
  sqlite3_free(__dest);
  pIter_00 = pIter;
LAB_001ca9e4:
  fts5MultiIterFree(pIter_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *pRc;
}

Assistant:

static int fts5FlushSecureDelete(
  Fts5Index *p,
  Fts5Structure *pStruct,
  const char *zTerm,
  int nTerm,
  i64 iRowid
){
  const int f = FTS5INDEX_QUERY_SKIPHASH;
  Fts5Iter *pIter = 0;            /* Used to find term instance */

  /* If the version number has not been set to SECUREDELETE, do so now. */
  if( p->pConfig->iVersion!=FTS5_CURRENT_VERSION_SECUREDELETE ){
    Fts5Config *pConfig = p->pConfig;
    sqlite3_stmt *pStmt = 0;
    fts5IndexPrepareStmt(p, &pStmt, sqlite3_mprintf(
          "REPLACE INTO %Q.'%q_config' VALUES ('version', %d)",
          pConfig->zDb, pConfig->zName, FTS5_CURRENT_VERSION_SECUREDELETE
    ));
    if( p->rc==SQLITE_OK ){
      int rc;
      sqlite3_step(pStmt);
      rc = sqlite3_finalize(pStmt);
      if( p->rc==SQLITE_OK ) p->rc = rc;
      pConfig->iCookie++;
      pConfig->iVersion = FTS5_CURRENT_VERSION_SECUREDELETE;
    }
  }

  fts5MultiIterNew(p, pStruct, f, 0, (const u8*)zTerm, nTerm, -1, 0, &pIter);
  if( fts5MultiIterEof(p, pIter)==0 ){
    i64 iThis = fts5MultiIterRowid(pIter);
    if( iThis<iRowid ){
      fts5MultiIterNextFrom(p, pIter, iRowid);
    }

    if( p->rc==SQLITE_OK
     && fts5MultiIterEof(p, pIter)==0
     && iRowid==fts5MultiIterRowid(pIter)
    ){
      Fts5SegIter *pSeg = &pIter->aSeg[pIter->aFirst[1].iFirst];
      fts5DoSecureDelete(p, pSeg);
    }
  }

  fts5MultiIterFree(pIter);
  return p->rc;
}